

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void createlabel(LexState *ls,TString *name,int line,int last)

{
  FuncState *fs;
  int iVar1;
  Labellist *l;
  
  fs = ls->fs;
  l = &ls->dyd->label;
  iVar1 = luaK_getlabel(fs);
  iVar1 = newlabelentry(ls,l,name,line,iVar1);
  if (last != 0) {
    l->arr[iVar1].nactvar = fs->bl->nactvar;
  }
  return;
}

Assistant:

static void createlabel (LexState *ls, TString *name, int line, int last) {
  FuncState *fs = ls->fs;
  Labellist *ll = &ls->dyd->label;
  int l = newlabelentry(ls, ll, name, line, luaK_getlabel(fs));
  if (last) {  /* label is last no-op statement in the block? */
    /* assume that locals are already out of scope */
    ll->arr[l].nactvar = fs->bl->nactvar;
  }
}